

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

double * getDWTmra(wt_object wt,double *wavecoeffs)

{
  int *length;
  int level;
  wave_object pwVar1;
  bool bVar2;
  int iVar3;
  double *reccoeff;
  int *piVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  level = wt->J;
  uVar7 = (ulong)level;
  iVar3 = wt->siglength;
  reccoeff = (double *)malloc((uVar7 + 1) * (long)iVar3 * 8);
  pwVar1 = wt->wave;
  length = wt->length;
  getDWTRecCoeff(wt->output,length,"appx",wt->ext,level,level,pwVar1->lpr,pwVar1->hpr,
                 pwVar1->lpr_len,iVar3,reccoeff);
  if (0 < (long)uVar7) {
    iVar3 = wt->siglength;
    lVar5 = 0;
    piVar4 = length;
    iVar6 = iVar3;
    do {
      lVar5 = (long)(int)lVar5 + (long)*piVar4;
      pwVar1 = wt->wave;
      getDWTRecCoeff(wt->output + lVar5,length,"det",wt->ext,(int)uVar7,level,pwVar1->lpr,
                     pwVar1->hpr,pwVar1->lpr_len,iVar3,reccoeff + iVar6);
      iVar3 = wt->siglength;
      iVar6 = iVar6 + iVar3;
      piVar4 = piVar4 + 1;
      bVar2 = 1 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  return reccoeff;
}

Assistant:

double *getDWTmra(wt_object wt, double *wavecoeffs) {
	int i, J, access,N;
	double *mra;
	J = wt->J;
	mra = (double*)malloc(sizeof(double)* wt->siglength*(J + 1));
	access = 0;
	

	// Approximation MRA
	getDWTRecCoeff(wt->output + access, wt->length, "appx", wt->ext, J, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra);

	// Details MRA
	N = wt->siglength;
	for (i = J; i > 0; --i) {
		access += wt->length[J - i];
		getDWTRecCoeff(wt->output + access, wt->length, "det", wt->ext, i, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra+N);
		N += wt->siglength;
	}
	
	return mra;
}